

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O2

StridedArrayView<1U,_const_unsigned_long_long> * __thiscall
Corrade::Containers::arrayCast<unsigned_long_long_const,1u,unsigned_long_const>
          (StridedArrayView<1U,_const_unsigned_long_long> *__return_storage_ptr__,Containers *this,
          StridedArrayView<1U,_const_unsigned_long> *view)

{
  ulong uVar1;
  ostream *output;
  Debug *pDVar2;
  ulong uVar3;
  Error EStack_38;
  
  uVar1 = *(ulong *)(this + 0x10);
  uVar3 = -uVar1;
  if (0 < (long)uVar1) {
    uVar3 = uVar1;
  }
  if ((uVar1 != 0) && (uVar3 < 8)) {
    output = Utility::Error::defaultOutput();
    Utility::Error::Error(&EStack_38,output,(Flags)0x0);
    pDVar2 = Utility::Debug::operator<<
                       (&EStack_38.super_Debug,"Containers::arrayCast(): can\'t fit a");
    pDVar2 = Utility::Debug::operator<<(pDVar2,8);
    (pDVar2->_immediateFlags)._value = (pDVar2->_immediateFlags)._value | 4;
    pDVar2 = Utility::Debug::operator<<(pDVar2,"-byte type into a stride of");
    Utility::Debug::operator<<(pDVar2,*(long *)(this + 0x10));
    Utility::Error::~Error(&EStack_38);
    abort();
  }
  __return_storage_ptr__->_data = *(ErasedType **)this;
  (__return_storage_ptr__->_size)._data[0] = *(unsigned_long *)(this + 8);
  (__return_storage_ptr__->_stride)._data[0] = uVar1;
  return __return_storage_ptr__;
}

Assistant:

StridedArrayView<dimensions, U> arrayCast(const StridedArrayView<dimensions, T>& view) {
    static_assert(std::is_standard_layout<T>::value, "the source type is not standard layout");
    static_assert(std::is_standard_layout<U>::value, "the target type is not standard layout");
    #ifndef CORRADE_NO_ASSERT
    for(unsigned i = 0; i != dimensions; ++i) {
        /* Unlike slice() etc, this is usually not called in tight loops and
           should be as checked as possible, so it's not a debug assert */
        CORRADE_ASSERT(!view._stride._data[i] || sizeof(U) <= std::size_t(view._stride._data[i] < 0 ? -view._stride._data[i] : view._stride._data[i]),
            "Containers::arrayCast(): can't fit a" << sizeof(U) << Utility::Debug::nospace << "-byte type into a stride of" << view._stride._data[i], {});
    }
    #endif
    return StridedArrayView<dimensions, U>{view._size, view._stride, view._data};
}